

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmtobj.cpp
# Opt level: O2

void __thiscall CVmObjTads::apply_undo(CVmObjTads *this,CVmUndoRecord *rec)

{
  vm_obj_id_t vVar1;
  vm_tadsobj_hdr *this_00;
  vm_tadsobj_prop *pvVar2;
  anon_union_8_8_cb74652f_for_val aVar3;
  undefined4 uVar4;
  vm_tadsobj_prop **ppvVar5;
  int iVar6;
  vm_tadsobj_prop *pvVar7;
  vm_tadsobj_prop **ppvVar8;
  vm_val_t *this_01;
  
  this_00 = (vm_tadsobj_hdr *)(this->super_CVmObject).ext_;
  if ((rec->id).prop == 0) {
    if ((rec->oldval).typ == VM_INT) {
      if ((rec->oldval).val.obj == 1) {
        *(byte *)&this_00->intern_obj_flags = (byte)this_00->intern_obj_flags & 0xfd;
      }
    }
    else {
      this_01 = &rec->oldval;
      iVar6 = vm_val_t::is_listlike(this_01);
      if (iVar6 != 0) {
        iVar6 = vm_val_t::ll_length(this_01);
        change_superclass_list(this,this_01,iVar6);
        return;
      }
    }
  }
  else {
    pvVar7 = vm_tadsobj_hdr::find_prop_entry(this_00,(uint)(rec->id).prop);
    if (pvVar7 != (vm_tadsobj_prop *)0x0) {
      uVar4 = *(undefined4 *)&(rec->oldval).field_0x4;
      aVar3 = (rec->oldval).val;
      (pvVar7->val).typ = (rec->oldval).typ;
      *(undefined4 *)&(pvVar7->val).field_0x4 = uVar4;
      (pvVar7->val).val = aVar3;
      if ((rec->oldval).typ == VM_EMPTY) {
        vVar1 = (rec->oldval).val.obj;
        if (vVar1 == 1) {
          pvVar7->flags = pvVar7->flags & 0xfe;
        }
        else if (vVar1 == 0) {
          ppvVar5 = (vm_tadsobj_prop **)
                    ((ulong)(((uint)(rec->id).prop & *(int *)&this_00->hash_siz - 1U) << 3) +
                    (long)this_00->hash_arr);
          do {
            ppvVar8 = ppvVar5;
            pvVar2 = *ppvVar8;
            if (pvVar2 == (vm_tadsobj_prop *)0x0) break;
            ppvVar5 = &pvVar2->nxt;
          } while (pvVar2 != pvVar7);
          if (pvVar2 == pvVar7) {
            *ppvVar8 = pvVar7->nxt;
            this_00->prop_entry_free = this_00->prop_entry_free - 1;
          }
        }
      }
    }
  }
  return;
}

Assistant:

void CVmObjTads::apply_undo(VMG_ CVmUndoRecord *rec)
{
    /* get my header */
    vm_tadsobj_hdr *hdr = get_hdr();

    /* 
     *   if the property is valid, it's a simple property change record;
     *   otherwise it's some other object-level change 
     */
    if (rec->id.prop == VM_INVALID_PROP)
    {
        /*
         *   Invalid property ID, so it's an object-level change:
         *   
         *   - int(1) -> object is newly modified (VMTO_OBJ_MOD flag was
         *   newly set)
         *   
         *   - list -> superclass list change
         */
        switch (rec->oldval.typ)
        {
        case VM_INT:
            switch (rec->oldval.val.intval)
            {
            case 1:
                /* VMTO_OBJ_MOD flag newly set - clear the flag */
                hdr->intern_obj_flags &= ~VMTO_OBJ_MOD;
                break;
            }
            break;

        default:
            /* check for a list, which indicates a superclass change */
            if (rec->oldval.is_listlike(vmg0_))
            {
                /* set the new superclass list */
                change_superclass_list(
                    vmg_ &rec->oldval, rec->oldval.ll_length(vmg0_));
            }
            break;
        }
    }
    else
    {
        /* find the property entry for the property being undone */
        vm_tadsobj_prop *entry = hdr->find_prop_entry(rec->id.prop);
        if (entry == 0)
        {
            /* can't find the property - something is out of whack */
            assert(FALSE);
            return;
        }
        
        /* restore the value from the record */
        entry->val = rec->oldval;
        
        /* if the old value is 'empty', it requires special handling */
        if (rec->oldval.typ == VM_EMPTY)
        {
            vm_tadsobj_prop *cur, **prv;
            unsigned int hash = hdr->calc_hash(rec->id.prop);
            
            /* 
             *   We use 'empty' records for multiple purposes, with the
             *   specific one indicated by the intval field. 
             */
            switch (rec->oldval.val.intval)
            {
            case 0:
                /*
                 *   Empty with intval 0 indicates a property addition, which
                 *   we undo by deleting the property.  First, find it in the
                 *   hash chain.  
                 */
                for (prv = &hdr->hash_arr[hash] ;
                     (cur = *prv) != 0 && cur != entry ;
                     prv = &cur->nxt) ;
                
                /* make sure we found it */
                if (cur == entry)
                {
                    /* unlink it */
                    *prv = entry->nxt;
                    
                    /* return it to the free list */
                    hdr->prop_entry_free -= 1;
                    assert(entry == &hdr->prop_entry_arr[hdr->prop_entry_free]);
                }
                else
                {
                    /* this should be impossible */
                    assert(FALSE);
                }
                break;
                
            case 1:
                /*
                 *   Empty with intval 1 indicates that we marked the slot as
                 *   newly modified, which we undo by clearing the modified
                 *   flag.
                 */
                entry->flags &= ~VMTO_PROP_MOD;
                break;
            }
        }
    }
}